

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlDebugDumpAttr(FILE *output,xmlAttrPtr attr,int depth)

{
  xmlDebugCtxt ctxt;
  xmlDebugCtxt local_c0;
  
  if (output != (FILE *)0x0) {
    xmlCtxtDumpInitCtxt(&local_c0);
    local_c0.output = output;
    local_c0.depth = depth;
    xmlCtxtDumpAttr(&local_c0,attr);
  }
  return;
}

Assistant:

void
xmlDebugDumpAttr(FILE *output, xmlAttrPtr attr, int depth) {
    xmlDebugCtxt ctxt;

    if (output == NULL) return;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    ctxt.depth = depth;
    xmlCtxtDumpAttr(&ctxt, attr);
    xmlCtxtDumpCleanCtxt(&ctxt);
}